

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O3

void Json_ReadTest(char *pFileName)

{
  void *__ptr;
  Vec_Wec_t *vObjs;
  int iVar1;
  Vec_Int_t *__ptr_00;
  long lVar2;
  long lVar3;
  Abc_Nam_t *pStrs;
  Abc_Nam_t *local_20;
  
  vObjs = Json_Read(pFileName,&local_20);
  if (vObjs == (Vec_Wec_t *)0x0) {
    return;
  }
  Json_Write("test.json",local_20,vObjs);
  Abc_NamDeref(local_20);
  iVar1 = vObjs->nCap;
  __ptr_00 = vObjs->pArray;
  if (iVar1 < 1) {
    if (__ptr_00 == (Vec_Int_t *)0x0) goto LAB_0032b70a;
  }
  else {
    lVar2 = 8;
    lVar3 = 0;
    do {
      __ptr = *(void **)((long)&__ptr_00->nCap + lVar2);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        __ptr_00 = vObjs->pArray;
        *(undefined8 *)((long)&__ptr_00->nCap + lVar2) = 0;
        iVar1 = vObjs->nCap;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar3 < iVar1);
  }
  free(__ptr_00);
LAB_0032b70a:
  free(vObjs);
  return;
}

Assistant:

void Json_ReadTest( char * pFileName )
{
    Abc_Nam_t * pStrs;
    Vec_Wec_t * vObjs;
    vObjs = Json_Read( pFileName, &pStrs );
    if ( vObjs == NULL )
        return;
    Json_Write( "test.json", pStrs, vObjs );
    Abc_NamDeref( pStrs );
    Vec_WecFree( vObjs );
}